

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemIntegerify(Mem *pMem)

{
  uint uVar1;
  i64 iVar2;
  
  iVar2 = sqlite3VdbeIntValue(pMem);
  (pMem->u).i = iVar2;
  uVar1._0_2_ = pMem->flags;
  uVar1._2_1_ = pMem->enc;
  uVar1._3_1_ = pMem->eSubtype;
  uVar1 = uVar1 & 0xfffff240 | 4;
  pMem->flags = (u16)uVar1;
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemIntegerify(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );

  pMem->u.i = sqlite3VdbeIntValue(pMem);
  MemSetTypeFlag(pMem, MEM_Int);
  return SQLITE_OK;
}